

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolslib.cpp
# Opt level: O2

int tools_add(lua_State *l)

{
  int iVar1;
  int iVar2;
  lua_Number n;
  lua_Number lVar3;
  
  iVar1 = lua_gettop(l);
  iVar2 = 0;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  n = 0.0;
  for (iVar1 = 1; iVar1 - iVar2 != 1; iVar1 = iVar1 + 1) {
    lVar3 = luaL_checknumber(l,iVar1);
    n = n + lVar3;
  }
  lua_pushnumber(l,n);
  return 1;
}

Assistant:

static int tools_add(lua_State *l) {
    int paramNum = lua_gettop(l);
    double sum = 0;
    for (int i = 1; i <= paramNum; i++) {
        double value = luaL_checknumber(l, i);
        sum += value;
    }
    lua_pushnumber(l, sum);

    return 1;
}